

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O2

void QPDF::trim_user_password(string *user_password)

{
  ulong uVar1;
  pointer pcVar2;
  int iVar3;
  char *__s1;
  unsigned_long uVar4;
  pointer __s;
  long local_50 [4];
  
  uVar1 = user_password->_M_string_length;
  if (0x1f < uVar1) {
    pcVar2 = (user_password->_M_dataplus)._M_p;
    __s = pcVar2;
    do {
      __s1 = strchr(__s,0x28);
      if (__s1 == (char *)0x0) {
        return;
      }
      local_50[0] = (long)__s1 - (long)pcVar2;
      uVar4 = QIntC::IntConverter<long,_unsigned_long,_true,_false>::convert(local_50);
      iVar3 = bcmp(__s1,padding_string,uVar1 - uVar4);
      __s = __s1 + 1;
    } while (iVar3 != 0);
    std::__cxx11::string::substr((ulong)local_50,(ulong)user_password);
    std::__cxx11::string::operator=((string *)user_password,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

void
QPDF::trim_user_password(std::string& user_password)
{
    // Although unnecessary, this routine trims the padding string from the end of a user password.
    // Its only purpose is for recovery of user passwords which is done in the test suite.
    char const* cstr = user_password.c_str();
    size_t len = user_password.length();
    if (len < key_bytes) {
        return;
    }

    char const* p1 = cstr;
    char const* p2 = nullptr;
    while ((p2 = strchr(p1, '\x28')) != nullptr) {
        size_t idx = toS(p2 - cstr);
        if (memcmp(p2, padding_string, len - idx) == 0) {
            user_password = user_password.substr(0, idx);
            return;
        } else {
            QTC::TC("qpdf", "QPDF_encryption skip 0x28");
            p1 = p2 + 1;
        }
    }
}